

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O2

void __thiscall File::append(File *this,string *line)

{
  int iVar1;
  string *__return_storage_ptr__;
  int *piVar2;
  char *args_1;
  int in_EDX;
  FILE *__stream;
  allocator<char> local_41;
  string local_40;
  
  __stream = (FILE *)this->_fh;
  if (__stream == (FILE *)0x0) {
    open(this,(char *)line,in_EDX);
    __stream = (FILE *)this->_fh;
    if (__stream == (FILE *)0x0) {
      return;
    }
  }
  fseek(__stream,0,2);
  iVar1 = fputs((line->_M_dataplus)._M_p,(FILE *)this->_fh);
  if (iVar1 != -1) {
    return;
  }
  __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"fputs error {1}: {2}",&local_41);
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  args_1 = strerror(iVar1);
  format<int,char*>(__return_storage_ptr__,&local_40,iVar1,args_1);
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void File::append (const std::string& line)
{
  if (!_fh)
    open ();

  if (_fh)
  {
    fseek (_fh, 0, SEEK_END);

    if (fputs (line.c_str (), _fh) == EOF)
      throw format ("fputs error {1}: {2}", errno, strerror (errno));
  }
}